

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall CConsole::ExecuteLineStroked(CConsole *this,int Stroke,char *pStr)

{
  long lVar1;
  uint uVar2;
  CResult *this_00;
  long in_FS_OFFSET;
  bool bVar3;
  int in_stack_ffffffffffffe7cc;
  CExecutionQueue *in_stack_ffffffffffffe7d0;
  int in_stack_ffffffffffffe7d8;
  int in_stack_ffffffffffffe7dc;
  CResult *in_stack_ffffffffffffe7e0;
  int in_stack_ffffffffffffe7e8;
  uint in_stack_ffffffffffffe7ec;
  undefined4 uStack_1808;
  int IsStrokeCommand;
  CCommand *pCommand;
  undefined4 in_stack_ffffffffffffe808;
  int iVar4;
  undefined4 in_stack_ffffffffffffe80c;
  int InString;
  char *pNextPart;
  char *pEnd;
  char *pStr_local;
  int Stroke_local;
  CConsole *this_local;
  char aBuf_2 [256];
  char aBuf_1 [256];
  char aBuf [256];
  CResult Result;
  
  Result.m_apArgs[1] = (char *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pStr_local = pStr;
  while( true ) {
    uVar2 = in_stack_ffffffffffffe7ec & 0xffffff;
    if (pStr_local != (char *)0x0) {
      uVar2 = CONCAT13(*pStr_local != '\0',(int3)in_stack_ffffffffffffe7ec);
    }
    in_stack_ffffffffffffe7ec = uVar2;
    if ((char)(in_stack_ffffffffffffe7ec >> 0x18) == '\0') break;
    CResult::CResult(in_stack_ffffffffffffe7e0);
    pNextPart = (char *)0x0;
    bVar3 = false;
    for (pEnd = pStr_local; *pEnd != '\0'; pEnd = pEnd + 1) {
      if (*pEnd == '\"') {
        bVar3 = (bool)(bVar3 ^ 1);
      }
      else if (*pEnd == '\\') {
        if (pEnd[1] == '\"') {
          pEnd = pEnd + 1;
        }
      }
      else if (!bVar3) {
        if (*pEnd == ';') {
          pNextPart = pEnd + 1;
          break;
        }
        if (*pEnd == '#') break;
      }
    }
    in_stack_ffffffffffffe7e8 =
         ParseStart(this,(CResult *)CONCAT44(in_stack_ffffffffffffe7ec,in_stack_ffffffffffffe7e8),
                    (char *)in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc);
    if (in_stack_ffffffffffffe7e8 == 0) {
      if (*Result.m_pCommand == '\0') {
        iVar4 = 1;
      }
      else {
        this_00 = (CResult *)
                  FindCommand((CConsole *)
                              CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
                              (char *)in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7cc);
        in_stack_ffffffffffffe7e0 = this_00;
        if (this_00 == (CResult *)0x0) {
          if (Stroke != 0) {
            str_format(aBuf_2,0x100,"No such command: %s.",Result.m_pCommand);
            (*((IInterface *)&(((CResult *)this)->super_IResult)._vptr_IResult)->_vptr_IInterface
              [0x19])(this,0,"console",aBuf_2);
            in_stack_ffffffffffffe7e0 = this_00;
          }
        }
        else {
          in_stack_ffffffffffffe7dc =
               IConsole::CCommandInfo::GetAccessLevel((CCommandInfo *)this_00);
          if (in_stack_ffffffffffffe7dc <
              *(int *)((long)(((CResult *)this)->super_IResult).m_aValue + 0x38)) {
            if (Stroke != 0) {
              str_format(aBuf_1,0x100,"Access for command %s denied.",Result.m_pCommand);
              (*((IInterface *)&(((CResult *)this)->super_IResult)._vptr_IResult)->_vptr_IInterface
                [0x19])(this,0,"console",aBuf_1);
            }
          }
          else {
            bVar3 = *Result.m_pCommand == '+';
            if (bVar3) {
              CResult::AddArgument
                        (&Result,*(char **)((long)(((CResult *)this)->super_IResult).m_aValue +
                                           ((long)Stroke * 2 + 2) * 4));
            }
            if ((Stroke != 0) || (bVar3)) {
              in_stack_ffffffffffffe7d8 =
                   ParseArgs((CConsole *)(ulong)CONCAT14(bVar3,uStack_1808),(CResult *)this,
                             (char *)CONCAT44(in_stack_ffffffffffffe80c,in_stack_ffffffffffffe808));
              if (in_stack_ffffffffffffe7d8 == 0) {
                if (((*(bool *)((long)(((CResult *)this)->super_IResult).m_aValue + 4) & 1U) == 0)
                   || ((*(uint *)((long)(this_00->super_IResult).m_aValue + 0x20) & 8) == 0)) {
                  (**(code **)((long)(this_00->super_IResult).m_aValue + 0x28))
                            (&Result.super_IResult,
                             *(void **)((long)(this_00->super_IResult).m_aValue + 0x30));
                }
                else {
                  CExecutionQueue::AddEntry(in_stack_ffffffffffffe7d0);
                  (*(CQueueEntry **)(((CResult *)this)->m_aStringStorage + 0x48))->m_pCommand =
                       (CCommand *)this_00;
                  CResult::operator=(in_stack_ffffffffffffe7e0,
                                     (CResult *)
                                     CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8));
                }
              }
              else {
                str_format(aBuf,0x100,"Invalid arguments... Usage: %s %s",
                           *(char **)(this_00->super_IResult).m_aValue);
                (*((IInterface *)&(((CResult *)this)->super_IResult)._vptr_IResult)->
                  _vptr_IInterface[0x19])(this,0,"console",aBuf);
              }
            }
          }
        }
        pStr_local = pNextPart;
        iVar4 = 0;
      }
    }
    else {
      iVar4 = 1;
    }
    CResult::~CResult((CResult *)0x22b524);
    if (iVar4 != 0) break;
    in_stack_ffffffffffffe808 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConsole::ExecuteLineStroked(int Stroke, const char *pStr)
{
	while(pStr && *pStr)
	{
		CResult Result;
		const char *pEnd = pStr;
		const char *pNextPart = 0;
		int InString = 0;

		while(*pEnd)
		{
			if(*pEnd == '"')
				InString ^= 1;
			else if(*pEnd == '\\') // escape sequences
			{
				if(pEnd[1] == '"')
					pEnd++;
			}
			else if(!InString)
			{
				if(*pEnd == ';') // command separator
				{
					pNextPart = pEnd+1;
					break;
				}
				else if(*pEnd == '#') // comment, no need to do anything more
					break;
			}

			pEnd++;
		}

		if(ParseStart(&Result, pStr, (pEnd-pStr) + 1) != 0)
			return;

		if(!*Result.m_pCommand)
			return;

		CCommand *pCommand = FindCommand(Result.m_pCommand, m_FlagMask);

		if(pCommand)
		{
			if(pCommand->GetAccessLevel() >= m_AccessLevel)
			{
				int IsStrokeCommand = 0;
				if(Result.m_pCommand[0] == '+')
				{
					// insert the stroke direction token
					Result.AddArgument(m_paStrokeStr[Stroke]);
					IsStrokeCommand = 1;
				}

				if(Stroke || IsStrokeCommand)
				{
					if(ParseArgs(&Result, pCommand->m_pParams))
					{
						char aBuf[256];
						str_format(aBuf, sizeof(aBuf), "Invalid arguments... Usage: %s %s", pCommand->m_pName, pCommand->m_pParams);
						Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
					}
					else if(m_StoreCommands && pCommand->m_Flags&CFGFLAG_STORE)
					{
						m_ExecutionQueue.AddEntry();
						m_ExecutionQueue.m_pLast->m_pCommand = pCommand;
						m_ExecutionQueue.m_pLast->m_Result = Result;
					}
					else
						pCommand->m_pfnCallback(&Result, pCommand->m_pUserData);
				}
			}
			else if(Stroke)
			{
				char aBuf[256];
				str_format(aBuf, sizeof(aBuf), "Access for command %s denied.", Result.m_pCommand);
				Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
			}
		}
		else if(Stroke)
		{
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), "No such command: %s.", Result.m_pCommand);
			Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
		}

		pStr = pNextPart;
	}
}